

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

Image * Image_Function::ConvertTo8Bit(Image16Bit *in)

{
  uint32_t uVar1;
  ImageTemplate<unsigned_short> *in_RSI;
  ImageTemplate<unsigned_char> *in_RDI;
  Image *out;
  uint8_t in_stack_ffffffffffffff76;
  uint8_t in_stack_ffffffffffffff77;
  uint32_t in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  ImageTemplate<unsigned_char> *this;
  uint32_t in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  Image *in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  Image16Bit *in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffe0;
  uint32_t in_stack_ffffffffffffffe8;
  undefined2 uVar2;
  
  this = in_RDI;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_stack_ffffffffffffff7c
             ,in_stack_ffffffffffffff78,in_stack_ffffffffffffff77,in_stack_ffffffffffffff76);
  PenguinV_Image::ImageTemplate<unsigned_short>::width(in_RSI);
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_short>::height(in_RSI);
  uVar2 = (undefined2)(uVar1 >> 0x10);
  PenguinV_Image::ImageTemplate<unsigned_short>::colorCount(in_RSI);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (this,(uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,(uint8_t)((ushort)uVar2 >> 8),
             (uint8_t)uVar2);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x119c4d);
  PenguinV_Image::ImageTemplate<unsigned_short>::width(in_RSI);
  PenguinV_Image::ImageTemplate<unsigned_short>::height(in_RSI);
  ConvertTo8Bit(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  return this;
}

Assistant:

Image ConvertTo8Bit( const Image16Bit & in )
    {
        Image out = Image().generate( in.width(), in.height(), in.colorCount() );
        ConvertTo8Bit( in, 0, 0, out, 0, 0, in.width(), in.height() );

        return out;
    }